

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O2

vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
* anon_unknown.dwarf_1612e9d::GetInvTxfm2dParamList(void)

{
  int iVar1;
  bool bVar2;
  vector<std::tuple<unsigned_char,unsigned_char,int,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,int,double>>>
  *in_RDI;
  int t;
  int iVar3;
  int s;
  long lVar4;
  tuple<unsigned_char,_unsigned_char,_int,_double> local_48;
  _Head_base<3UL,_double,_false> local_38;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    iVar1 = (&(anonymous_namespace)::max_error_ls)[lVar4];
    local_38._M_head_impl = (double)(&(anonymous_namespace)::avg_error_ls)[lVar4];
    for (iVar3 = 0; iVar3 != 0x10; iVar3 = iVar3 + 1) {
      bVar2 = libaom_test::IsTxSizeTypeValid((TX_SIZE)lVar4,(TX_TYPE)iVar3);
      if (bVar2) {
        local_48.super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_int,_double>.
        super__Tuple_impl<1UL,_unsigned_char,_int,_double>.super__Tuple_impl<2UL,_int,_double>.
        super__Tuple_impl<3UL,_double>.super__Head_base<3UL,_double,_false>._M_head_impl =
             (_Head_base<3UL,_double,_false>)(_Head_base<3UL,_double,_false>)local_38._M_head_impl;
        local_48.super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_int,_double>.
        super__Tuple_impl<1UL,_unsigned_char,_int,_double>.super__Tuple_impl<2UL,_int,_double>.
        super__Head_base<2UL,_int,_false>._M_head_impl = iVar1;
        local_48.super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_int,_double>.
        super__Tuple_impl<1UL,_unsigned_char,_int,_double>.super__Tuple_impl<2UL,_int,_double>.
        _12_1_ = (TX_SIZE)lVar4;
        local_48.super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_int,_double>.
        super__Tuple_impl<1UL,_unsigned_char,_int,_double>.super__Tuple_impl<2UL,_int,_double>.
        _13_1_ = (TX_TYPE)iVar3;
        std::
        vector<std::tuple<unsigned_char,unsigned_char,int,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,int,double>>>
        ::emplace_back<std::tuple<unsigned_char,unsigned_char,int,double>>(in_RDI,&local_48);
      }
    }
  }
  return (vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
          *)in_RDI;
}

Assistant:

vector<AV1InvTxfm2dParam> GetInvTxfm2dParamList() {
  vector<AV1InvTxfm2dParam> param_list;
  for (int s = 0; s < TX_SIZES; ++s) {
    const int max_error = max_error_ls[s];
    const double avg_error = avg_error_ls[s];
    for (int t = 0; t < TX_TYPES; ++t) {
      const TxType tx_type = static_cast<TxType>(t);
      const TxSize tx_size = static_cast<TxSize>(s);
      if (libaom_test::IsTxSizeTypeValid(tx_size, tx_type)) {
        param_list.push_back(
            AV1InvTxfm2dParam(tx_type, tx_size, max_error, avg_error));
      }
    }
  }
  return param_list;
}